

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O3

_Bool object_runes_known(object *obj)

{
  _Bool _Var1;
  
  if (obj->known != (object *)0x0) {
    _Var1 = curses_are_equal(obj,obj->known);
    if (_Var1) {
      _Var1 = object_non_curse_runes_known(obj);
      return _Var1;
    }
  }
  return false;
}

Assistant:

bool object_runes_known(const struct object *obj)
{
	/* No known object */
	if (!obj->known) return false;

	/* Not all curses known */
	if (!curses_are_equal(obj, obj->known)) {
		return false;
	}

	/* Answer is now the same as for non-curse runes */
	return object_non_curse_runes_known(obj);
}